

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

int __thiscall
fmp4_stream::ingest_stream::write_init_to_file
          (ingest_stream *this,string *ofile,uint nfrags,bool write_sep_files)

{
  pointer *ppuVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  ulong uVar6;
  ostream *poVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  long *plVar9;
  uint uVar10;
  uint i;
  long lVar11;
  uint uVar12;
  ulong index;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segment_data;
  string __str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> init_data;
  ofstream out_file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2c8;
  long lStack_2b0;
  string *local_2a8;
  uint local_29c;
  long *local_298;
  uint local_290;
  long local_288 [2];
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  undefined8 local_240;
  long local_238;
  long local_230;
  filebuf local_228 [24];
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  if ((int)CONCAT71(in_register_00000009,write_sep_files) == 0) {
    std::ofstream::ofstream(&local_230,(string *)ofile,_S_bin);
    if (*(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18)) == 0) {
      local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2a8 = ofile;
      get_init_segment_data(this,&local_2c8);
      std::ostream::write((char *)&local_230,
                          (long)local_2c8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if (nfrags != 0) {
        index = 0;
        do {
          uVar6 = ((long)(this->media_fragment_).
                         super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->media_fragment_).
                         super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x1cac083126e978d5;
          if (index <= uVar6 && uVar6 - index != 0) {
            if (local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            get_media_segment_data(this,index,&local_2c8);
            std::ostream::write((char *)&local_230,
                                (long)local_2c8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
          }
          index = index + 1;
        } while (nfrags != index);
      }
      std::ofstream::close();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," done written init segment to file: ",0x24);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(local_2a8->_M_dataplus)._M_p,
                          local_2a8->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," error writing stream to file ",0x1e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  else {
    local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a8 = ofile;
    get_init_segment_data(this,&local_258);
    local_29c = nfrags;
    if (nfrags != 0) {
      ppuVar1 = &local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      local_238 = _VTT;
      local_240 = __filebuf;
      uVar10 = 0;
      uVar12 = 0;
      do {
        cVar4 = '\x01';
        if (0x27 < uVar12) {
          uVar8 = uVar12 >> 2;
          cVar3 = '\x04';
          do {
            cVar4 = cVar3;
            if (uVar8 < 100) {
              cVar4 = cVar4 + -2;
              goto LAB_00108b0d;
            }
            if (uVar8 < 1000) {
              cVar4 = cVar4 + -1;
              goto LAB_00108b0d;
            }
            if (uVar8 < 10000) goto LAB_00108b0d;
            bVar2 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar3 = cVar4 + '\x04';
          } while (bVar2);
          cVar4 = cVar4 + '\x01';
        }
LAB_00108b0d:
        local_298 = local_288;
        std::__cxx11::string::_M_construct((ulong)&local_298,cVar4);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_298,local_290,uVar12 >> 2);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_268 = *plVar9;
          lStack_260 = plVar5[3];
          local_278 = &local_268;
        }
        else {
          local_268 = *plVar9;
          local_278 = (long *)*plVar5;
        }
        local_270 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_278,(ulong)(local_2a8->_M_dataplus)._M_p);
        plVar9 = plVar5 + 2;
        if ((pointer *)*plVar5 == (pointer *)plVar9) {
          local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
          lStack_2b0 = plVar5[3];
          local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppuVar1;
        }
        else {
          local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
          local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar5;
        }
        local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::ofstream::ofstream(&local_230,(string *)&local_2c8,_S_bin);
        if ((pointer *)
            local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar1) {
          operator_delete(local_2c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(local_2c8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (local_278 != &local_268) {
          operator_delete(local_278,local_268 + 1);
        }
        if (local_298 != local_288) {
          operator_delete(local_298,local_288[0] + 1);
        }
        local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (*(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18)) == 0) {
          std::ostream::write((char *)&local_230,
                              (long)local_258.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          lVar11 = 0;
          do {
            if (local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            get_media_segment_data(this,(ulong)uVar10 + lVar11,&local_2c8);
            std::ostream::write((char *)&local_230,
                                (long)local_2c8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          std::ofstream::close();
        }
        if (local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2c8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_230 = local_238;
        *(undefined8 *)(local_228 + *(long *)(local_238 + -0x18) + -8) = local_240;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(local_138);
        uVar12 = uVar12 + 4;
        uVar10 = uVar10 + 0x10;
      } while (uVar12 < local_29c);
    }
    if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return 0;
}

Assistant:

int ingest_stream::write_init_to_file(
		std::string &ofile, 
		unsigned int nfrags, 
		bool write_sep_files)
	{
		// write the stream to an output file
		if (!write_sep_files) {
			std::ofstream out_file(ofile, std::ofstream::binary);

			if (out_file.good())
			{
				std::vector<uint8_t> init_data;
				get_init_segment_data(init_data);
				out_file.write((char *)init_data.data(), init_data.size());
				for (unsigned int k = 0; k < nfrags; k++) {
					if (k < media_fragment_.size()) {
						init_data.clear();
						get_media_segment_data(k, init_data);
						out_file.write((char *)init_data.data(), init_data.size());
					}
				}
				out_file.close();
				std::cout << " done written init segment to file: " << ofile << std::endl;
			}
			else
			{
				std::cout << " error writing stream to file " << std::endl;
			}
		}
		else 
		{
			std::vector<uint8_t> init_data;
			get_init_segment_data(init_data);
			const unsigned int chunk_count=4;
			for (unsigned int k = 0; k < nfrags; k+=chunk_count) 
			{
				std::ofstream out_file( std::to_string(k/chunk_count) + "_" + ofile, std::ofstream::binary);
				std::vector<uint8_t> segment_data;
				if (out_file.good())
				{
					out_file.write((char *)init_data.data(), init_data.size());
					for (unsigned int i = 0; i < chunk_count; i++) {
						segment_data.clear();
						get_media_segment_data(k*chunk_count + i, segment_data);
						out_file.write((char *)segment_data.data(), segment_data.size());
					}
					out_file.close();
				}
			}
		}
		return 0;
	}